

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O3

void __thiscall
TEST_TestFailure_FeatureUnsupported_Test::testBody(TEST_TestFailure_FeatureUnsupported_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  FeatureUnsupportedFailure f;
  undefined1 local_98 [136];
  
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)local_98,"SOME_FEATURE");
  SimpleString::SimpleString((SimpleString *)(local_98 + 0x10),"");
  FeatureUnsupportedFailure::FeatureUnsupportedFailure
            ((FeatureUnsupportedFailure *)(local_98 + 0x20),pUVar1,"fail.cpp",2,
             (SimpleString *)local_98,(SimpleString *)(local_98 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_98 + 0x10));
  SimpleString::~SimpleString((SimpleString *)local_98);
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_98);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_98);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "The feature \"SOME_FEATURE\" is not supported in this environment or with the feature set selected when building the library."
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x1ab,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_98);
  TestFailure::~TestFailure((TestFailure *)(local_98 + 0x20));
  return;
}

Assistant:

TEST(TestFailure, FeatureUnsupported)
{
    FeatureUnsupportedFailure f(test, failFileName, failLineNumber, "SOME_FEATURE", "");
    FAILURE_EQUAL("The feature \"SOME_FEATURE\" is not supported in this environment or with the feature set selected when building the library.", f);
}